

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O1

void __thiscall
CNetBan::MakeBanInfo<NETADDR>
          (CNetBan *this,CBan<NETADDR> *pBan,char *pBuf,uint BuffSize,int Type,int *pLastInfoQuery)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char aTemp [256];
  char aBuf [256];
  char acStack_238 [256];
  char local_138 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pBan == (CBan<NETADDR> *)0x0 || pBuf == (char *)0x0) {
    if (BuffSize != 0) {
      *pBuf = '\0';
    }
    goto LAB_00139c5a;
  }
  if (Type == 0) {
    str_copy(local_138,"You have been banned",0x100);
  }
  else {
    if (Type == 3) {
      net_addr_str((NETADDR *)pBan,local_138,0x30,0);
      str_format(acStack_238,0x100,"\'%s\'",local_138);
      pcVar3 = "unbanned %s";
    }
    else if (Type == 2) {
      net_addr_str((NETADDR *)pBan,local_138,0x30,0);
      str_format(acStack_238,0x100,"\'%s\'",local_138);
      pcVar3 = "banned %s";
    }
    else {
      if (Type != 1) {
        local_138[0] = '\0';
        goto LAB_00139bd4;
      }
      net_addr_str((NETADDR *)pBan,local_138,0x30,0);
      str_format(acStack_238,0x100,"\'%s\'",local_138);
      pcVar3 = "%s banned";
    }
    str_format(local_138,0x100,pcVar3,acStack_238);
  }
LAB_00139bd4:
  iVar1 = time_timestamp();
  iVar2 = (pBan->m_Info).m_Expires;
  if (iVar2 == -1) {
    pcVar3 = "%s for life (%s)";
LAB_00139c05:
    str_format(pBuf,BuffSize,pcVar3,local_138,(pBan->m_Info).m_aReason);
  }
  else {
    iVar2 = iVar2 - iVar1;
    if (iVar2 < 0x3d) {
      pcVar3 = "%s for 1 minute (%s)";
      goto LAB_00139c05;
    }
    str_format(pBuf,BuffSize,"%s for %d minutes (%s)",local_138,(ulong)(iVar2 + 0x3b) / 0x3c,
               (pBan->m_Info).m_aReason);
  }
  if (pLastInfoQuery != (int *)0x0) {
    *pLastInfoQuery = (pBan->m_Info).m_LastInfoQuery;
    (pBan->m_Info).m_LastInfoQuery = iVar1;
  }
LAB_00139c5a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBan::MakeBanInfo(CBan<T> *pBan, char *pBuf, unsigned BuffSize, int Type, int *pLastInfoQuery)
{
	if(pBan == 0 || pBuf == 0)
	{
		if(BuffSize > 0)
			pBuf[0] = 0;
		return;
	}

	// build type based part
	char aBuf[256];
	if(Type == MSGTYPE_PLAYER)
		str_copy(aBuf, "You have been banned", sizeof(aBuf));
	else
	{
		char aTemp[256];
		switch(Type)
		{
		case MSGTYPE_LIST:
			str_format(aBuf, sizeof(aBuf), "%s banned", NetToString(&pBan->m_Data, aTemp, sizeof(aTemp))); break;
		case MSGTYPE_BANADD:
			str_format(aBuf, sizeof(aBuf), "banned %s", NetToString(&pBan->m_Data, aTemp, sizeof(aTemp))); break;
		case MSGTYPE_BANREM:
			str_format(aBuf, sizeof(aBuf), "unbanned %s", NetToString(&pBan->m_Data, aTemp, sizeof(aTemp))); break;
		default:
			aBuf[0] = 0;
		}
	}

	// add info part
	int Time = time_timestamp();
	if(pBan->m_Info.m_Expires != CBanInfo::EXPIRES_NEVER)
	{
		int Mins = ((pBan->m_Info.m_Expires-Time) + 59) / 60;
		if(Mins <= 1)
			str_format(pBuf, BuffSize, "%s for 1 minute (%s)", aBuf, pBan->m_Info.m_aReason);
		else
			str_format(pBuf, BuffSize, "%s for %d minutes (%s)", aBuf, Mins, pBan->m_Info.m_aReason);
	}
	else
		str_format(pBuf, BuffSize, "%s for life (%s)", aBuf, pBan->m_Info.m_aReason);

	if(pLastInfoQuery)
	{
		*pLastInfoQuery = pBan->m_Info.m_LastInfoQuery;
		pBan->m_Info.m_LastInfoQuery = Time;
	}
}